

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleProvide(capnp::rpc::Provide::Reader_const&)::
ProvidePipelineHook::~ProvidePipelineHook(ProvidePipelineHook *this)

{
  if (*(long *)(this + 0x18) != 0) {
    *(undefined8 *)(this + 0x18) = 0;
    (**(code **)**(undefined8 **)(this + 0x10))();
  }
  kj::Refcounted::~Refcounted((Refcounted *)this);
  operator_delete(this + -8,0x28);
  return;
}

Assistant:

ProvidePipelineHook(kj::Own<void> awaiter): awaiter(kj::mv(awaiter)) {}